

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

Expression * wasm::TypeUpdating::fixLocalGet(LocalGet *get,Module *wasm)

{
  Index IVar1;
  uintptr_t uVar2;
  Expression *pEVar3;
  Type TVar4;
  TupleMake *this;
  size_t sVar5;
  LocalGet *pLVar6;
  TupleExtract *this_00;
  Type *pTVar7;
  RefAs *this_01;
  uintptr_t uVar8;
  Iterator local_70;
  Type local_60;
  Type type;
  undefined1 local_50 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Builder builder;
  
  local_60.id = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
  if ((local_60.id & 3) == 0 && 6 < local_60.id) {
    TVar4 = getValidLocalType(local_60,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar4.id;
    this = (TupleMake *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
    (((SpecificExpression<(wasm::Expression::Id)81> *)
     &this->super_SpecificExpression<(wasm::Expression::Id)57>)->super_Expression)._id = RefAsId;
    (((SpecificExpression<(wasm::Expression::Id)81> *)
     &this->super_SpecificExpression<(wasm::Expression::Id)57>)->super_Expression).type.id = 0;
    *(RefAsOp *)
     &(this->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = RefAsNonNull;
    (this->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = (size_t)get;
    RefAs::finalize((RefAs *)this);
    get = (LocalGet *)this;
  }
  else if ((local_60.id & 1) != 0 && 6 < local_60.id) {
    TVar4 = getValidLocalType(local_60,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar4.id;
    sVar5 = wasm::Type::size(&local_60);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,sVar5,
               (allocator_type *)&local_70);
    elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)wasm;
    sVar5 = wasm::Type::size(&local_60);
    if ((int)sVar5 != 0) {
      type.id = sVar5 & 0xffffffff;
      uVar8 = 0;
      do {
        pLVar6 = get;
        if (uVar8 != 0) {
          IVar1 = get->index;
          uVar2 = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
          pLVar6 = (LocalGet *)
                   MixedArena::allocSpace
                             ((MixedArena *)
                              (elems.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40),0x18,8);
          (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id =
               LocalGetId;
          pLVar6->index = IVar1;
          (pLVar6->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
               uVar2;
        }
        this_00 = (TupleExtract *)
                  MixedArena::allocSpace
                            ((MixedArena *)
                             (elems.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40),0x20,8);
        (this_00->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
             TupleExtractId;
        (this_00->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
        this_00->tuple = (Expression *)pLVar6;
        this_00->index = (Index)uVar8;
        TupleExtract::finalize(this_00);
        *(TupleExtract **)((long)local_50 + uVar8 * 8) = this_00;
        local_70.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             &local_60;
        local_70.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = uVar8;
        pTVar7 = wasm::Type::Iterator::operator*(&local_70);
        if ((pTVar7->id & 3) == 0 && 6 < pTVar7->id) {
          pEVar3 = *(pointer)((long)local_50 + uVar8 * 8);
          this_01 = (RefAs *)MixedArena::allocSpace
                                       ((MixedArena *)
                                        (elems.
                                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40),
                                        0x20,8);
          (this_01->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression._id =
               RefAsId;
          (this_01->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.type.id = 0
          ;
          this_01->op = RefAsNonNull;
          this_01->value = pEVar3;
          RefAs::finalize(this_01);
          *(RefAs **)((long)local_50 + uVar8 * 8) = this_01;
        }
        uVar8 = uVar8 + 1;
      } while (type.id != uVar8);
    }
    get = (LocalGet *)
          Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                    ((Builder *)
                     &elems.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50);
    if (local_50 != (undefined1  [8])0x0) {
      operator_delete((void *)local_50,
                      (long)elems.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_50);
    }
  }
  return (Expression *)(TupleMake *)get;
}

Assistant:

Expression* fixLocalGet(LocalGet* get, Module& wasm) {
  if (get->type.isNonNullable()) {
    // The get should now return a nullable value, and a ref.as_non_null
    // fixes that up.
    get->type = getValidLocalType(get->type, wasm.features);
    return Builder(wasm).makeRefAs(RefAsNonNull, get);
  }
  if (get->type.isTuple()) {
    auto type = get->type;
    get->type = getValidLocalType(type, wasm.features);
    std::vector<Expression*> elems(type.size());
    Builder builder(wasm);
    for (Index i = 0, size = type.size(); i < size; ++i) {
      auto* elemGet =
        i == 0 ? get : builder.makeLocalGet(get->index, get->type);
      elems[i] = builder.makeTupleExtract(elemGet, i);
      if (type[i].isNonNullable()) {
        elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
      }
    }
    return builder.makeTupleMake(std::move(elems));
  }
  return get;
}